

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O3

HTTPAPIEX_HANDLE
Blob_CreateHttpConnection
          (char *blobStorageHostname,char *certificates,HTTP_PROXY_OPTIONS *proxyOptions,
          char *networkInterface,size_t timeoutInMilliseconds)

{
  HTTPAPIEX_RESULT HVar1;
  HTTPAPIEX_HANDLE handle;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  size_t local_30;
  
  local_30 = timeoutInMilliseconds;
  if (blobStorageHostname == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (HTTPAPIEX_HANDLE)0x0;
    }
    pcVar4 = "Required storage hostname is NULL, blobStorageHostname=%p";
    iVar3 = 0x59;
LAB_00127d7d:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
              ,"Blob_CreateHttpConnection",iVar3,1,pcVar4);
    return (HTTPAPIEX_HANDLE)0x0;
  }
  handle = HTTPAPIEX_Create(blobStorageHostname);
  if (handle == (HTTPAPIEX_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (HTTPAPIEX_HANDLE)0x0;
    }
    pcVar4 = "unable to create a HTTPAPIEX_HANDLE";
    iVar3 = 0x60;
    goto LAB_00127d7d;
  }
  if ((timeoutInMilliseconds == 0) ||
     (HVar1 = HTTPAPIEX_SetOption(handle,"timeout",&local_30), HVar1 != HTTPAPIEX_ERROR)) {
    if ((certificates == (char *)0x0) ||
       (HVar1 = HTTPAPIEX_SetOption(handle,"TrustedCerts",certificates), HVar1 != HTTPAPIEX_ERROR))
    {
      if (((proxyOptions == (HTTP_PROXY_OPTIONS *)0x0) ||
          (proxyOptions->host_address == (char *)0x0)) ||
         (HVar1 = HTTPAPIEX_SetOption(handle,"proxy_data",proxyOptions), HVar1 != HTTPAPIEX_ERROR))
      {
        if (networkInterface == (char *)0x0) {
          return handle;
        }
        HVar1 = HTTPAPIEX_SetOption(handle,"CURLOPT_INTERFACE",networkInterface);
        if (HVar1 != HTTPAPIEX_ERROR) {
          return handle;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00127e2a;
        pcVar4 = "failure in setting network interface";
        iVar3 = 0x76;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00127e2a;
        pcVar4 = "failure in setting proxy options";
        iVar3 = 0x70;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00127e2a;
      pcVar4 = "failure in setting trusted certificates";
      iVar3 = 0x6a;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00127e2a;
    pcVar4 = "unable to set blob transfer timeout";
    iVar3 = 100;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
            ,"Blob_CreateHttpConnection",iVar3,1,pcVar4);
LAB_00127e2a:
  HTTPAPIEX_Destroy(handle);
  return (HTTPAPIEX_HANDLE)0x0;
}

Assistant:

HTTPAPIEX_HANDLE Blob_CreateHttpConnection(const char* blobStorageHostname, const char* certificates, const HTTP_PROXY_OPTIONS *proxyOptions, const char* networkInterface, const size_t timeoutInMilliseconds)
{
    HTTPAPIEX_HANDLE httpApiExHandle;
    
    if (blobStorageHostname == NULL)
    {
        LogError("Required storage hostname is NULL, blobStorageHostname=%p", blobStorageHostname);
        httpApiExHandle = NULL;
    }
    else
    {
        if ((httpApiExHandle = HTTPAPIEX_Create(blobStorageHostname)) == NULL)
        {
            LogError("unable to create a HTTPAPIEX_HANDLE");
        }
        else if ((timeoutInMilliseconds != 0) && (HTTPAPIEX_SetOption(httpApiExHandle, OPTION_HTTP_TIMEOUT, &timeoutInMilliseconds) == HTTPAPIEX_ERROR))
        {
            LogError("unable to set blob transfer timeout");
            HTTPAPIEX_Destroy(httpApiExHandle);
            httpApiExHandle = NULL;
        }
        else if ((certificates != NULL) && (HTTPAPIEX_SetOption(httpApiExHandle, OPTION_TRUSTED_CERT, certificates) == HTTPAPIEX_ERROR))
        {
            LogError("failure in setting trusted certificates");
            HTTPAPIEX_Destroy(httpApiExHandle);
            httpApiExHandle = NULL;
        }
        else if ((proxyOptions != NULL && proxyOptions->host_address != NULL) && HTTPAPIEX_SetOption(httpApiExHandle, OPTION_HTTP_PROXY, proxyOptions) == HTTPAPIEX_ERROR)
        {
            LogError("failure in setting proxy options");
            HTTPAPIEX_Destroy(httpApiExHandle);
            httpApiExHandle = NULL;
        }
        else if ((networkInterface != NULL) && HTTPAPIEX_SetOption(httpApiExHandle, OPTION_CURL_INTERFACE, networkInterface) == HTTPAPIEX_ERROR)
        {
            LogError("failure in setting network interface");
            HTTPAPIEX_Destroy(httpApiExHandle);
            httpApiExHandle = NULL;
        }
    }

    return httpApiExHandle;
}